

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConstantPadLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  unsigned_long uVar3;
  bool bVar4;
  LayerUnion LVar5;
  unsigned_long *puVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  uint uVar10;
  ulong *puVar11;
  size_type *psVar12;
  ulong uVar13;
  Result *_result;
  uint uVar14;
  int index;
  uint uVar15;
  uint uVar16;
  string err;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ulong local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ConstantPad","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if (layer->_oneof_case_[0] == 0x483) {
    LVar5 = layer->layer_;
  }
  else {
    LVar5.constantpad_ = Specification::ConstantPaddingLayerParams::default_instance();
  }
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
LAB_00322938:
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  uVar16 = ((LVar5.convolution_)->kernelsize_).current_size_;
  if ((uVar16 & 1) == 0) {
    if (uVar16 != 0) {
      if (((LVar5.constantpad_)->padtogivenoutputsizemode_ == true) && (0 < (int)uVar16 >> 1)) {
        index = 0;
        uVar14 = 0;
        local_58 = (ulong)(uint)((int)uVar16 >> 1);
        do {
          puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get
                             (&(LVar5.convolution_)->kernelsize_,index);
          uVar3 = *puVar6;
          puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get
                             (&(LVar5.convolution_)->kernelsize_,index + 1);
          if ((0 < (int)uVar3) && (0 < (int)*puVar6)) {
            std::operator+(&local_78,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
            puVar11 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar11) {
              local_88 = *puVar11;
              lStack_80 = plVar7[3];
              local_98 = &local_88;
            }
            else {
              local_88 = *puVar11;
              local_98 = (ulong *)*plVar7;
            }
            local_90 = plVar7[1];
            *plVar7 = (long)puVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            uVar16 = 1;
            if (uVar14 < 10) goto LAB_00322d4e;
            uVar13 = (ulong)uVar14;
            uVar15 = 4;
            goto LAB_00322d12;
          }
          uVar14 = uVar14 + 1;
          index = index + 2;
        } while ((uint)local_58 != uVar14);
      }
      goto LAB_00322938;
    }
    std::operator+(&local_f8,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_d8.field_2._M_allocated_capacity = *psVar12;
      local_d8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar12;
      local_d8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
  }
  else {
    std::operator+(&local_78,"In \'ConstantPad\' layer \'",(layer->name_).ptr_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_88 = *puVar11;
      lStack_80 = plVar7[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *puVar11;
      local_98 = (ulong *)*plVar7;
    }
    local_90 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    uVar14 = -uVar16;
    if (0 < (int)uVar16) {
      uVar14 = uVar16;
    }
    uVar15 = 1;
    if (9 < uVar14) {
      uVar13 = (ulong)uVar14;
      uVar10 = 4;
      do {
        uVar15 = uVar10;
        uVar9 = (uint)uVar13;
        if (uVar9 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_00322ab9;
        }
        if (uVar9 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_00322ab9;
        }
        if (uVar9 < 10000) goto LAB_00322ab9;
        uVar13 = uVar13 / 10000;
        uVar10 = uVar15 + 4;
      } while (99999 < uVar9);
      uVar15 = uVar15 + 1;
    }
LAB_00322ab9:
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar15 - (char)((int)uVar16 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_b8 + (ulong)(uVar16 >> 0x1f)),uVar15,uVar14);
    uVar13 = 0xf;
    if (local_98 != &local_88) {
      uVar13 = local_88;
    }
    if (uVar13 < (ulong)(local_b0 + local_90)) {
      uVar13 = 0xf;
      if (local_b8 != local_a8) {
        uVar13 = local_a8[0];
      }
      if (uVar13 < (ulong)(local_b0 + local_90)) goto LAB_00322b28;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
    }
    else {
LAB_00322b28:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f8.field_2._M_allocated_capacity = *psVar12;
      local_f8.field_2._8_8_ = puVar8[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar12;
      local_f8._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_f8._M_string_length = puVar8[1];
    *puVar8 = psVar12;
    puVar8[1] = 0;
    *(undefined1 *)psVar12 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    psVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_d8.field_2._M_allocated_capacity = *psVar12;
      local_d8.field_2._8_8_ = puVar8[3];
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar12;
      local_d8._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_d8._M_string_length = puVar8[1];
    *puVar8 = psVar12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return __return_storage_ptr__;
  }
  goto LAB_00322c68;
  while( true ) {
    if (uVar10 < 10000) goto LAB_00322d4e;
    uVar13 = uVar13 / 10000;
    uVar15 = uVar16 + 4;
    if (uVar10 < 100000) break;
LAB_00322d12:
    uVar16 = uVar15;
    uVar10 = (uint)uVar13;
    if (uVar10 < 100) {
      uVar16 = uVar16 - 2;
      goto LAB_00322d4e;
    }
    if (uVar10 < 1000) {
      uVar16 = uVar16 - 1;
      goto LAB_00322d4e;
    }
  }
  uVar16 = uVar16 + 1;
LAB_00322d4e:
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar16);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,uVar16,uVar14);
  uVar13 = 0xf;
  if (local_98 != &local_88) {
    uVar13 = local_88;
  }
  if (uVar13 < (ulong)(local_b0 + local_90)) {
    uVar13 = 0xf;
    if (local_b8 != local_a8) {
      uVar13 = local_a8[0];
    }
    if (uVar13 < (ulong)(local_b0 + local_90)) goto LAB_00322db6;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_00322db6:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  psVar12 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_f8.field_2._M_allocated_capacity = *psVar12;
    local_f8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar12;
    local_f8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_f8._M_string_length = puVar8[1];
  *puVar8 = psVar12;
  puVar8[1] = 0;
  *(undefined1 *)psVar12 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
  psVar12 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_d8.field_2._M_allocated_capacity = *psVar12;
    local_d8.field_2._8_8_ = puVar8[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar12;
    local_d8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_d8._M_string_length = puVar8[1];
  *puVar8 = psVar12;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return __return_storage_ptr__;
  }
LAB_00322c68:
  operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConstantPadLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ConstantPad", blobNameToRank));

    const auto& params = layer.constantpad();

    if (layer.input_size() == 1) {
        int len = params.padamounts_size();
        if (len % 2 != 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' parameter is " + std::to_string(len) + ", an odd value, which is not allowed.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (len == 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' cannot be zero when only 1 input is provided.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (params.padtogivenoutputsizemode()) {
            for (int i=0; i < len/2; i++) {
                int pad_a = (int)params.padamounts(2*i);
                int pad_b = (int)params.padamounts(2*i+1);
                if (pad_a > 0 && pad_b > 0) {
                    const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', 'padToGivenOutputSizeMode' is true, and both padding values corresponding to dimension " + std::to_string(i) + " are non zero, which is invalid. Only one value can be non-zero.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}